

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Num.cpp
# Opt level: O2

void __thiscall Num::~Num(Num *this)

{
  std::__cxx11::string::~string((string *)&this->base);
  return;
}

Assistant:

Num::Num(Num::Short length, Byte dig) // constructor that create a number of a given length consisting of a certain digit
{
    size = length;
    base.append(length, (char) dig + 48);
}